

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

int lodepng_color_mode_equal(LodePNGColorMode *a,LodePNGColorMode *b)

{
  uchar *puVar1;
  uchar *puVar2;
  long lVar3;
  
  if (((((a->colortype == b->colortype) && (a->bitdepth == b->bitdepth)) &&
       (a->key_defined == b->key_defined)) &&
      ((a->key_defined == 0 ||
       (((a->key_r == b->key_r && (a->key_g == b->key_g)) && (a->key_b == b->key_b)))))) &&
     (a->palettesize == b->palettesize)) {
    lVar3 = 0;
    do {
      if (a->palettesize << 2 == lVar3) {
        return 1;
      }
      puVar1 = a->palette + lVar3;
      puVar2 = b->palette + lVar3;
      lVar3 = lVar3 + 1;
    } while (*puVar1 == *puVar2);
  }
  return 0;
}

Assistant:

static int lodepng_color_mode_equal(const LodePNGColorMode* a, const LodePNGColorMode* b) {
  size_t i;
  if (a->colortype != b->colortype) return 0;
  if (a->bitdepth != b->bitdepth) return 0;
  if (a->key_defined != b->key_defined) return 0;
  if (a->key_defined) {
    if (a->key_r != b->key_r) return 0;
    if (a->key_g != b->key_g) return 0;
    if (a->key_b != b->key_b) return 0;
  }
  if (a->palettesize != b->palettesize) return 0;
  for (i = 0; i != a->palettesize * 4; ++i) {
    if (a->palette[i] != b->palette[i]) return 0;
  }
  return 1;
}